

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFileSpecObjectHelper.cc
# Opt level: O2

QPDFFileSpecObjectHelper *
QPDFFileSpecObjectHelper::createFileSpec
          (QPDFFileSpecObjectHelper *__return_storage_ptr__,QPDF *qpdf,string *filename,
          string *fullpath)

{
  function<void_(Pipeline_*)> fStack_78;
  QPDFEFStreamObjectHelper local_58;
  
  QUtil::file_provider(&fStack_78,fullpath);
  QPDFEFStreamObjectHelper::createEFStream(&local_58,qpdf,&fStack_78);
  createFileSpec(__return_storage_ptr__,qpdf,filename,&local_58);
  QPDFEFStreamObjectHelper::~QPDFEFStreamObjectHelper(&local_58);
  std::_Function_base::~_Function_base(&fStack_78.super__Function_base);
  return __return_storage_ptr__;
}

Assistant:

QPDFFileSpecObjectHelper
QPDFFileSpecObjectHelper::createFileSpec(
    QPDF& qpdf, std::string const& filename, std::string const& fullpath)
{
    return createFileSpec(
        qpdf,
        filename,
        QPDFEFStreamObjectHelper::createEFStream(qpdf, QUtil::file_provider(fullpath)));
}